

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint32_t *puVar1;
  uint uVar2;
  mbedtls_key_exchange_type_t mVar3;
  uint uVar4;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  mbedtls_ssl_config *pmVar5;
  uchar *puVar6;
  size_t __n;
  mbedtls_x509_crt *pmVar7;
  uint uVar8;
  uchar uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  mbedtls_x509_crt *pmVar13;
  mbedtls_x509_crl **ppmVar14;
  mbedtls_ecp_group_id *pmVar15;
  ushort uVar16;
  mbedtls_ecp_group_id mVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  
  ciphersuite = ssl->transform_negotiate->ciphersuite_info;
  uVar2 = *(uint *)&ssl->conf->field_0x174;
  mVar3 = ciphersuite->key_exchange;
  if (((mVar3 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
      ((0x960U >> (mVar3 & 0x1f) & 1) != 0)) ||
     (((uVar2 & 1) != 0 && (mVar3 == MBEDTLS_KEY_EXCHANGE_RSA_PSK)))) {
LAB_001151f3:
    ssl->state = ssl->state + 1;
    return 0;
  }
  uVar4 = ssl->handshake->sni_authmode;
  uVar8 = uVar2 >> 2 & 3;
  if (uVar4 != 3) {
    uVar8 = uVar4;
  }
  if (((uVar2 & 1) != 0) && (uVar8 == 0)) {
    ssl->session_negotiate->verify_result = 0x80;
    goto LAB_001151f3;
  }
  iVar10 = mbedtls_ssl_read_record(ssl);
  if (iVar10 != 0) {
    return iVar10;
  }
  ssl->state = ssl->state + 1;
  pmVar5 = ssl->conf;
  uVar2 = *(uint *)&pmVar5->field_0x174;
  if (((((uVar2 & 1) != 0) && (ssl->minor_ver != 0)) &&
      (uVar18 = (ulong)((uVar2 & 2) << 2), ssl->in_hslen == uVar18 + 7)) &&
     (((ssl->in_msgtype == 0x16 && (puVar6 = ssl->in_msg, *puVar6 == '\v')) &&
      (uVar18 = uVar18 | 4, puVar6[uVar18 + 2] == '\0' && *(short *)(puVar6 + uVar18) == 0)))) {
    ssl->session_negotiate->verify_result = 0x40;
    if (uVar8 != 1) {
      return -0x7480;
    }
    return 0;
  }
  if (ssl->in_msgtype != 0x16) {
    iVar10 = -0x7700;
    if (pmVar5 == (mbedtls_ssl_config *)0x0 || ssl == (mbedtls_ssl_context *)0x0) {
      return -0x7700;
    }
    ssl->out_msgtype = 0x15;
    ssl->out_msglen = 2;
    *ssl->out_msg = '\x02';
    ssl->out_msg[1] = '\n';
    goto LAB_00115469;
  }
  puVar6 = ssl->in_msg;
  if (*puVar6 == '\v') {
    uVar18 = (ulong)((uVar2 & 2) << 2);
    if (((uVar18 + 10 <= ssl->in_hslen) && (uVar20 = uVar18 | 4, puVar6[uVar20] == '\0')) &&
       (ssl->in_hslen ==
        (ushort)(*(ushort *)(puVar6 + uVar20 + 1) << 8 | *(ushort *)(puVar6 + uVar20 + 1) >> 8) +
        uVar20 + 3)) {
      pmVar13 = ssl->session_negotiate->peer_cert;
      if (pmVar13 != (mbedtls_x509_crt *)0x0) {
        mbedtls_x509_crt_free(pmVar13);
        free(ssl->session_negotiate->peer_cert);
      }
      pmVar13 = (mbedtls_x509_crt *)calloc(1,0x228);
      ssl->session_negotiate->peer_cert = pmVar13;
      if (pmVar13 == (mbedtls_x509_crt *)0x0) {
        iVar10 = -0x7f00;
        if (ssl == (mbedtls_ssl_context *)0x0) {
          return -0x7f00;
        }
        if (ssl->conf == (mbedtls_ssl_config *)0x0) {
          return -0x7f00;
        }
        ssl->out_msgtype = 0x15;
        ssl->out_msglen = 2;
        *ssl->out_msg = '\x02';
        ssl->out_msg[1] = 'P';
        goto LAB_00115469;
      }
      mbedtls_x509_crt_init(pmVar13);
      uVar18 = uVar18 | 7;
      iVar10 = 0;
      uVar20 = ssl->in_hslen;
      while (uVar18 < uVar20) {
        puVar6 = ssl->in_msg;
        if ((puVar6[uVar18] != '\0') ||
           (uVar16 = *(ushort *)(puVar6 + uVar18 + 1) << 8 | *(ushort *)(puVar6 + uVar18 + 1) >> 8,
           uVar16 < 0x80)) {
LAB_00115584:
          if (ssl == (mbedtls_ssl_context *)0x0) {
            return -0x7a00;
          }
          if (ssl->conf == (mbedtls_ssl_config *)0x0) {
            return -0x7a00;
          }
          goto LAB_0011543f;
        }
        lVar19 = uVar18 + 3;
        uVar18 = (ulong)uVar16 + lVar19;
        if (uVar20 < uVar18) goto LAB_00115584;
        iVar10 = mbedtls_x509_crt_parse_der
                           (ssl->session_negotiate->peer_cert,puVar6 + lVar19,(ulong)uVar16);
        if (iVar10 < -0x2580) {
          if (iVar10 != -0x262e) {
            if (iVar10 == -0x2880) {
              uVar9 = 'P';
            }
            else {
LAB_0011573e:
              uVar9 = '*';
            }
LAB_00115740:
            if (ssl == (mbedtls_ssl_context *)0x0) {
              return iVar10;
            }
            if (ssl->conf == (mbedtls_ssl_config *)0x0) {
              return iVar10;
            }
            ssl->out_msgtype = 0x15;
            ssl->out_msglen = 2;
            *ssl->out_msg = '\x02';
            ssl->out_msg[1] = uVar9;
            goto LAB_00115469;
          }
        }
        else if (iVar10 != 0) {
          if (iVar10 != -0x2580) goto LAB_0011573e;
          uVar9 = '+';
          goto LAB_00115740;
        }
        uVar20 = ssl->in_hslen;
      }
      pmVar5 = ssl->conf;
      if (((pmVar5->field_0x174 & 1) == 0) && (ssl->renego_status == 1)) {
        pmVar13 = ssl->session->peer_cert;
        if (pmVar13 != (mbedtls_x509_crt *)0x0) {
          __n = (pmVar13->raw).len;
          pmVar7 = ssl->session_negotiate->peer_cert;
          if ((__n == (pmVar7->raw).len) &&
             (iVar11 = bcmp((pmVar13->raw).p,(pmVar7->raw).p,__n), iVar11 == 0)) goto LAB_00115563;
        }
        iVar10 = -0x7a00;
        if (pmVar5 == (mbedtls_ssl_config *)0x0 || ssl == (mbedtls_ssl_context *)0x0) {
          return -0x7a00;
        }
        ssl->out_msgtype = 0x15;
        ssl->out_msglen = 2;
        *ssl->out_msg = '\x02';
        ssl->out_msg[1] = '1';
      }
      else {
LAB_00115563:
        if (uVar8 == 0) {
          return iVar10;
        }
        pmVar13 = ssl->handshake->sni_ca_chain;
        if (pmVar13 == (mbedtls_x509_crt *)0x0) {
          pmVar13 = pmVar5->ca_chain;
          ppmVar14 = &pmVar5->ca_crl;
        }
        else {
          ppmVar14 = &ssl->handshake->sni_ca_crl;
        }
        iVar10 = mbedtls_x509_crt_verify_with_profile
                           (ssl->session_negotiate->peer_cert,pmVar13,*ppmVar14,pmVar5->cert_profile
                            ,ssl->hostname,&ssl->session_negotiate->verify_result,pmVar5->f_vrfy,
                            pmVar5->p_vrfy);
        pmVar7 = ssl->session_negotiate->peer_cert;
        iVar11 = mbedtls_pk_can_do(&pmVar7->pk,MBEDTLS_PK_ECKEY);
        if (iVar11 != 0) {
          pmVar15 = ssl->conf->curve_list;
          if ((pmVar15 != (mbedtls_ecp_group_id *)0x0) &&
             (mVar17 = *pmVar15, mVar17 != MBEDTLS_ECP_DP_NONE)) {
            do {
              pmVar15 = pmVar15 + 1;
              if (mVar17 == *(pmVar7->pk).pk_ctx) goto LAB_00115641;
              mVar17 = *pmVar15;
            } while (mVar17 != MBEDTLS_ECP_DP_NONE);
          }
          puVar1 = &ssl->session_negotiate->verify_result;
          *puVar1 = *puVar1 | 0x10000;
          if (iVar10 == 0) {
            iVar10 = -0x7a00;
          }
        }
LAB_00115641:
        iVar12 = mbedtls_ssl_check_cert_usage
                           (ssl->session_negotiate->peer_cert,ciphersuite,
                            ~*(uint *)&ssl->conf->field_0x174 & 1,
                            &ssl->session_negotiate->verify_result);
        iVar11 = -0x7a00;
        if (iVar10 != 0) {
          iVar11 = iVar10;
        }
        if (iVar12 == 0) {
          iVar11 = iVar10;
        }
        iVar12 = 0;
        if (iVar11 != -0x7a00 && iVar11 != -0x2700) {
          iVar12 = iVar11;
        }
        if (uVar8 != 1) {
          iVar12 = iVar11;
        }
        iVar10 = -0x7680;
        if (uVar8 != 2) {
          iVar10 = iVar12;
        }
        if (pmVar13 != (mbedtls_x509_crt *)0x0) {
          iVar10 = iVar12;
        }
        if (iVar10 == 0) {
          return 0;
        }
        uVar2 = ssl->session_negotiate->verify_result;
        uVar9 = '1';
        if (((((uVar2 >> 8 & 1) == 0) && (uVar9 = '*', (uVar2 & 4) == 0)) &&
            (uVar9 = '+', (uVar2 & 0x1b800) == 0)) &&
           ((uVar9 = '-', (uVar2 & 1) == 0 && (uVar9 = ',', (uVar2 & 2) == 0)))) {
          uVar9 = (char)((uVar2 & 8) >> 3) * '\x02' + '.';
        }
        if (ssl == (mbedtls_ssl_context *)0x0) {
          return iVar10;
        }
        if (ssl->conf == (mbedtls_ssl_config *)0x0) {
          return iVar10;
        }
        ssl->out_msgtype = 0x15;
        ssl->out_msglen = 2;
        *ssl->out_msg = '\x02';
        ssl->out_msg[1] = uVar9;
      }
      goto LAB_00115469;
    }
  }
  if (pmVar5 == (mbedtls_ssl_config *)0x0 || ssl == (mbedtls_ssl_context *)0x0) {
    return -0x7a00;
  }
LAB_0011543f:
  iVar10 = -0x7a00;
  ssl->out_msgtype = 0x15;
  ssl->out_msglen = 2;
  *ssl->out_msg = '\x02';
  ssl->out_msg[1] = '2';
LAB_00115469:
  mbedtls_ssl_write_record(ssl);
  return iVar10;
}

Assistant:

int mbedtls_ssl_parse_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    int authmode = ssl->conf->authmode;
    uint8_t alert;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
#endif

    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_SKIP_VERIFY;
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }
#endif

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        /* mbedtls_ssl_read_record may have sent an alert already. We
           let it decide whether to alert. */
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_SRV_C)
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    /*
     * Check if the client sent an empty certificate
     */
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_msglen  == 2                        &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT            &&
            ssl->in_msg[0]  == MBEDTLS_SSL_ALERT_LEVEL_WARNING  &&
            ssl->in_msg[1]  == MBEDTLS_SSL_ALERT_MSG_NO_CERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "SSLv3 client has no certificate" ) );

            /* The client was asked for a certificate but didn't send
               one. The client should know what's going on, so we
               don't send an alert. */
            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len( ssl ) &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
            ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
            memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ), "\0\0\0", 3 ) == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLSv1 client has no certificate" ) );

            /* The client was asked for a certificate but didn't send
               one. The client should know what's going on, so we
               don't send an alert. */
            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
#endif /* MBEDTLS_SSL_SRV_C */

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE ||
        ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 3 + 3 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = ( ssl->in_msg[i+1] << 8 ) | ssl->in_msg[i+2];

    if( ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    /* In case we tried to reuse a session but it failed */
    if( ssl->session_negotiate->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( ssl->session_negotiate->peer_cert );
        mbedtls_free( ssl->session_negotiate->peer_cert );
    }

    if( ( ssl->session_negotiate->peer_cert = mbedtls_calloc( 1,
                    sizeof( mbedtls_x509_crt ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                       sizeof( mbedtls_x509_crt ) ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    mbedtls_x509_crt_init( ssl->session_negotiate->peer_cert );

    i += 3;

    while( i < ssl->in_hslen )
    {
        if( ssl->in_msg[i] != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        n = ( (unsigned int) ssl->in_msg[i + 1] << 8 )
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if( n < 128 || i + n > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        ret = mbedtls_x509_crt_parse_der( ssl->session_negotiate->peer_cert,
                                  ssl->in_msg + i, n );
        switch( ret )
        {
        case 0: /*ok*/
        case MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + MBEDTLS_ERR_OID_NOT_FOUND:
            /* Ignore certificate with an unknown algorithm: maybe a
               prior certificate was already trusted. */
            break;

        case MBEDTLS_ERR_X509_ALLOC_FAILED:
            alert = MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR;
            goto crt_parse_der_failed;

        case MBEDTLS_ERR_X509_UNKNOWN_VERSION:
            alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            goto crt_parse_der_failed;

        default:
            alert = MBEDTLS_SSL_ALERT_MSG_BAD_CERT;
        crt_parse_der_failed:
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL, alert );
            MBEDTLS_SSL_DEBUG_RET( 1, " mbedtls_x509_crt_parse_der", ret );
            return( ret );
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT( 3, "peer certificate", ssl->session_negotiate->peer_cert );

    /*
     * On client, make sure the server cert doesn't change during renego to
     * avoid "triple handshake" attack: https://secure-resumption.com/
     */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->session->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "new server cert during renegotiation" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ACCESS_DENIED );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        if( ssl->session->peer_cert->raw.len !=
            ssl->session_negotiate->peer_cert->raw.len ||
            memcmp( ssl->session->peer_cert->raw.p,
                    ssl->session_negotiate->peer_cert->raw.p,
                    ssl->session->peer_cert->raw.len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "server cert changed during renegotiation" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_ACCESS_DENIED );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

    if( authmode != MBEDTLS_SSL_VERIFY_NONE )
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if( ssl->handshake->sni_ca_chain != NULL )
        {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        }
        else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        /*
         * Main check: verify certificate
         */
        ret = mbedtls_x509_crt_verify_with_profile(
                                ssl->session_negotiate->peer_cert,
                                ca_chain, ca_crl,
                                ssl->conf->cert_profile,
                                ssl->hostname,
                               &ssl->session_negotiate->verify_result,
                                ssl->conf->f_vrfy, ssl->conf->p_vrfy );

        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "x509_verify_cert", ret );
        }

        /*
         * Secondary checks: always done, but change 'ret' only if it was 0
         */

#if defined(MBEDTLS_ECP_C)
        {
            const mbedtls_pk_context *pk = &ssl->session_negotiate->peer_cert->pk;

            /* If certificate uses an EC key, make sure the curve is OK */
            if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECKEY ) &&
                mbedtls_ssl_check_curve( ssl, mbedtls_pk_ec( *pk )->grp.id ) != 0 )
            {
                ssl->session_negotiate->verify_result |= MBEDTLS_X509_BADCERT_BAD_KEY;

                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (EC key curve)" ) );
                if( ret == 0 )
                    ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
            }
        }
#endif /* MBEDTLS_ECP_C */

        if( mbedtls_ssl_check_cert_usage( ssl->session_negotiate->peer_cert,
                                 ciphersuite_info,
                                 ! ssl->conf->endpoint,
                                 &ssl->session_negotiate->verify_result ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (usage extensions)" ) );
            if( ret == 0 )
                ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
        }

        /* mbedtls_x509_crt_verify_with_profile is supposed to report a
         * verification failure through MBEDTLS_ERR_X509_CERT_VERIFY_FAILED,
         * with details encoded in the verification flags. All other kinds
         * of error codes, including those from the user provided f_vrfy
         * functions, are treated as fatal and lead to a failure of
         * ssl_parse_certificate even if verification was optional. */
        if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL &&
            ( ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED ||
              ret == MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE ) )
        {
            ret = 0;
        }

        if( ca_chain == NULL && authmode == MBEDTLS_SSL_VERIFY_REQUIRED )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no CA chain" ) );
            ret = MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED;
        }

        if( ret != 0 )
        {
            /* The certificate may have been rejected for several reasons.
               Pick one and send the corresponding alert. Which alert to send
               may be a subject of debate in some cases. */
            if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_OTHER )
                alert = MBEDTLS_SSL_ALERT_MSG_ACCESS_DENIED;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_CN_MISMATCH )
                alert = MBEDTLS_SSL_ALERT_MSG_BAD_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_KEY_USAGE )
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_EXT_KEY_USAGE )
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_NS_CERT_TYPE )
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_BAD_PK )
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_BAD_KEY )
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_EXPIRED )
                alert = MBEDTLS_SSL_ALERT_MSG_CERT_EXPIRED;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_REVOKED )
                alert = MBEDTLS_SSL_ALERT_MSG_CERT_REVOKED;
            else if( ssl->session_negotiate->verify_result & MBEDTLS_X509_BADCERT_NOT_TRUSTED )
                alert = MBEDTLS_SSL_ALERT_MSG_UNKNOWN_CA;
            else
                alert = MBEDTLS_SSL_ALERT_MSG_CERT_UNKNOWN;
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            alert );
        }

#if defined(MBEDTLS_DEBUG_C)
        if( ssl->session_negotiate->verify_result != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "! Certificate verification flags %x",
                                        ssl->session_negotiate->verify_result ) );
        }
        else
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Certificate verification flags clear" ) );
        }
#endif /* MBEDTLS_DEBUG_C */
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate" ) );

    return( ret );
}